

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::NamedBase::NamedBase(NamedBase *this,string *name_,string *help_,Options options_)

{
  pointer pcVar1;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Base_0021a368;
  (this->super_Base).options = options_;
  (this->super_Base).matched = false;
  (this->super_Base).help._M_dataplus._M_p = (pointer)&(this->super_Base).help.field_2;
  pcVar1 = (help_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Base).help,pcVar1,pcVar1 + help_->_M_string_length);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0021a7d8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  this->kickout = false;
  (this->defaultString)._M_dataplus._M_p = (pointer)&(this->defaultString).field_2;
  (this->defaultString)._M_string_length = 0;
  (this->defaultString).field_2._M_local_buf[0] = '\0';
  this->defaultStringManual = false;
  (this->choicesStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->choicesStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->choicesStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->choicesStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

NamedBase(const std::string &name_, const std::string &help_, Options options_ = {}) : Base(help_, options_), name(name_) {}